

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall FBehavior::FBehavior(FBehavior *this)

{
  FBehavior *this_local;
  
  TArray<FBehavior_*,_FBehavior_*>::TArray(&this->Imports);
  TArray<int,_int>::TArray(&this->JumpPoints);
  this->NumScripts = 0;
  this->NumFunctions = 0;
  this->NumArrays = 0;
  this->NumTotalArrays = 0;
  this->Scripts = (ScriptPtr *)0x0;
  this->Functions = (ScriptFunction *)0x0;
  this->Arrays = (ArrayInfo **)0x0;
  this->ArrayStore = (ArrayInfo *)0x0;
  this->Chunks = (BYTE *)0x0;
  this->Data = (BYTE *)0x0;
  this->Format = ACS_Unknown;
  this->LumpNum = -1;
  memset(this->MapVarStore,0,0x200);
  this->ModuleName[0] = '\0';
  this->FunctionProfileData = (ACSProfileInfo *)0x0;
  return;
}

Assistant:

FBehavior::FBehavior()
{
	NumScripts = 0;
	NumFunctions = 0;
	NumArrays = 0;
	NumTotalArrays = 0;
	Scripts = NULL;
	Functions = NULL;
	Arrays = NULL;
	ArrayStore = NULL;
	Chunks = NULL;
	Data = NULL;
	Format = ACS_Unknown;
	LumpNum = -1;
	memset (MapVarStore, 0, sizeof(MapVarStore));
	ModuleName[0] = 0;
	FunctionProfileData = NULL;

}